

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O2

int run_test_fs_event_start_and_close(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined8 uVar3;
  char *pcVar4;
  uv_fs_event_t fs_event2;
  uv_fs_event_t fs_event1;
  uv_fs_event_t local_120;
  uv_fs_event_t local_98;
  
  puVar2 = uv_default_loop();
  create_dir("watch_dir");
  iVar1 = uv_fs_event_init(puVar2,&local_98);
  if (iVar1 == 0) {
    iVar1 = uv_fs_event_start(&local_98,fs_event_cb_dir,"watch_dir",0);
    if (iVar1 == 0) {
      iVar1 = uv_fs_event_init(puVar2,&local_120);
      if (iVar1 == 0) {
        iVar1 = uv_fs_event_start(&local_120,fs_event_cb_dir,"watch_dir",0);
        if (iVar1 == 0) {
          uv_close((uv_handle_t *)&local_120,close_cb);
          uv_close((uv_handle_t *)&local_98,close_cb);
          uv_run(puVar2,UV_RUN_DEFAULT);
          if (close_cb_called == 2) {
            remove("watch_dir/");
            puVar2 = uv_default_loop();
            close_loop(puVar2);
            puVar2 = uv_default_loop();
            iVar1 = uv_loop_close(puVar2);
            if (iVar1 == 0) {
              return 0;
            }
            pcVar4 = "0 == uv_loop_close(uv_default_loop())";
            uVar3 = 0x3e5;
          }
          else {
            pcVar4 = "close_cb_called == 2";
            uVar3 = 0x3e2;
          }
        }
        else {
          pcVar4 = "r == 0";
          uVar3 = 0x3db;
        }
      }
      else {
        pcVar4 = "r == 0";
        uVar3 = 0x3d9;
      }
    }
    else {
      pcVar4 = "r == 0";
      uVar3 = 0x3d6;
    }
  }
  else {
    pcVar4 = "r == 0";
    uVar3 = 0x3d4;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-event.c"
          ,uVar3,pcVar4);
  abort();
}

Assistant:

TEST_IMPL(fs_event_start_and_close) {
#if defined(NO_FS_EVENTS)
  RETURN_SKIP(NO_FS_EVENTS);
#endif
  uv_loop_t* loop;
  uv_fs_event_t fs_event1;
  uv_fs_event_t fs_event2;
  int r;

  loop = uv_default_loop();

  create_dir("watch_dir");

  r = uv_fs_event_init(loop, &fs_event1);
  ASSERT(r == 0);
  r = uv_fs_event_start(&fs_event1, fs_event_cb_dir, "watch_dir", 0);
  ASSERT(r == 0);

  r = uv_fs_event_init(loop, &fs_event2);
  ASSERT(r == 0);
  r = uv_fs_event_start(&fs_event2, fs_event_cb_dir, "watch_dir", 0);
  ASSERT(r == 0);

  uv_close((uv_handle_t*) &fs_event2, close_cb);
  uv_close((uv_handle_t*) &fs_event1, close_cb);

  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT(close_cb_called == 2);

  remove("watch_dir/");
  MAKE_VALGRIND_HAPPY();
  return 0;
}